

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

int google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
              (FieldDescriptor *field,Message *message)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  int32 iVar4;
  uint32 uVar5;
  undefined4 extraout_var;
  ulong uVar7;
  int64 iVar8;
  uint64 uVar9;
  MessageLite *pMVar10;
  EnumValueDescriptor *pEVar11;
  string *local_a8;
  string *value;
  string scratch;
  int j_9;
  int j_8;
  int j_7;
  int j_6;
  int j_5;
  int j_4;
  int j_3;
  int j_2;
  int j_1;
  int j;
  int data_size;
  int count;
  Reflection *message_reflection;
  Message *message_local;
  FieldDescriptor *field_local;
  long *plVar6;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar2);
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    j = (**(code **)(*plVar6 + 0x30))(plVar6,message,field);
  }
  else {
    uVar7 = (**(code **)(*plVar6 + 0x28))(plVar6,message,field);
    j = (int)((uVar7 & 1) != 0);
  }
  j_1 = 0;
  TVar3 = FieldDescriptor::type(field);
  switch(TVar3) {
  case TYPE_DOUBLE:
    j_1 = j * 8;
    break;
  case TYPE_FLOAT:
    j_1 = j * 4;
    break;
  case TYPE_INT64:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_3 = 0; j_3 < j; j_3 = j_3 + 1) {
        iVar8 = (**(code **)(*plVar6 + 0x120))(plVar6,message,field,j_3);
        iVar2 = WireFormatLite::Int64Size(iVar8);
        j_1 = iVar2 + j_1;
      }
    }
    else {
      iVar8 = (**(code **)(*plVar6 + 0x70))(plVar6,message,field);
      j_1 = WireFormatLite::Int64Size(iVar8);
    }
    break;
  case TYPE_UINT64:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_7 = 0; j_7 < j; j_7 = j_7 + 1) {
        uVar9 = (**(code **)(*plVar6 + 0x130))(plVar6,message,field,j_7);
        iVar2 = WireFormatLite::UInt64Size(uVar9);
        j_1 = iVar2 + j_1;
      }
    }
    else {
      uVar9 = (**(code **)(*plVar6 + 0x80))(plVar6,message,field);
      j_1 = WireFormatLite::UInt64Size(uVar9);
    }
    break;
  case TYPE_INT32:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_2 = 0; j_2 < j; j_2 = j_2 + 1) {
        iVar4 = (**(code **)(*plVar6 + 0x118))(plVar6,message,field,j_2);
        iVar2 = WireFormatLite::Int32Size(iVar4);
        j_1 = iVar2 + j_1;
      }
    }
    else {
      iVar4 = (**(code **)(*plVar6 + 0x68))(plVar6,message,field);
      j_1 = WireFormatLite::Int32Size(iVar4);
    }
    break;
  case TYPE_FIXED64:
    j_1 = j * 8;
    break;
  case TYPE_FIXED32:
    j_1 = j * 4;
    break;
  case TYPE_BOOL:
    j_1 = j;
    break;
  case TYPE_STRING:
  case TYPE_BYTES:
    for (scratch.field_2._8_4_ = 0; (int)scratch.field_2._8_4_ < j;
        scratch.field_2._8_4_ = scratch.field_2._8_4_ + 1) {
      std::__cxx11::string::string((string *)&value);
      bVar1 = FieldDescriptor::is_repeated(field);
      if (bVar1) {
        local_a8 = (string *)
                   (**(code **)(*plVar6 + 0x168))(plVar6,message,field,scratch.field_2._8_4_,&value)
        ;
      }
      else {
        local_a8 = (string *)(**(code **)(*plVar6 + 0xb8))(plVar6,message,field,&value);
      }
      iVar2 = WireFormatLite::StringSize(local_a8);
      j_1 = iVar2 + j_1;
      std::__cxx11::string::~string((string *)&value);
    }
    break;
  case TYPE_GROUP:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_8 = 0; j_8 < j; j_8 = j_8 + 1) {
        pMVar10 = (MessageLite *)(**(code **)(*plVar6 + 0x160))(plVar6,message,field,j_8);
        iVar2 = WireFormatLite::GroupSize(pMVar10);
        j_1 = iVar2 + j_1;
      }
    }
    else {
      pMVar10 = (MessageLite *)(**(code **)(*plVar6 + 0xb0))(plVar6,message,field,0);
      j_1 = WireFormatLite::GroupSize(pMVar10);
    }
    break;
  case TYPE_MESSAGE:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_9 = 0; j_9 < j; j_9 = j_9 + 1) {
        pMVar10 = (MessageLite *)(**(code **)(*plVar6 + 0x160))(plVar6,message,field,j_9);
        iVar2 = WireFormatLite::MessageSize(pMVar10);
        j_1 = iVar2 + j_1;
      }
    }
    else {
      pMVar10 = (MessageLite *)(**(code **)(*plVar6 + 0xb0))(plVar6,message,field,0);
      j_1 = WireFormatLite::MessageSize(pMVar10);
    }
    break;
  case TYPE_UINT32:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_6 = 0; j_6 < j; j_6 = j_6 + 1) {
        uVar5 = (**(code **)(*plVar6 + 0x128))(plVar6,message,field,j_6);
        iVar2 = WireFormatLite::UInt32Size(uVar5);
        j_1 = iVar2 + j_1;
      }
    }
    else {
      uVar5 = (**(code **)(*plVar6 + 0x78))(plVar6,message,field);
      j_1 = WireFormatLite::UInt32Size(uVar5);
    }
    break;
  case TYPE_ENUM:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (scratch.field_2._12_4_ = 0; (int)scratch.field_2._12_4_ < j;
          scratch.field_2._12_4_ = scratch.field_2._12_4_ + 1) {
        pEVar11 = (EnumValueDescriptor *)
                  (**(code **)(*plVar6 + 0x158))(plVar6,message,field,scratch.field_2._12_4_);
        iVar2 = EnumValueDescriptor::number(pEVar11);
        iVar2 = WireFormatLite::EnumSize(iVar2);
        j_1 = iVar2 + j_1;
      }
    }
    else {
      pEVar11 = (EnumValueDescriptor *)(**(code **)(*plVar6 + 0xa8))(plVar6,message,field);
      iVar2 = EnumValueDescriptor::number(pEVar11);
      j_1 = WireFormatLite::EnumSize(iVar2);
    }
    break;
  case TYPE_SFIXED32:
    j_1 = j * 4;
    break;
  case TYPE_SFIXED64:
    j_1 = j * 8;
    break;
  case TYPE_SINT32:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_4 = 0; j_4 < j; j_4 = j_4 + 1) {
        iVar4 = (**(code **)(*plVar6 + 0x118))(plVar6,message,field,j_4);
        iVar2 = WireFormatLite::SInt32Size(iVar4);
        j_1 = iVar2 + j_1;
      }
    }
    else {
      iVar4 = (**(code **)(*plVar6 + 0x68))(plVar6,message,field);
      j_1 = WireFormatLite::SInt32Size(iVar4);
    }
    break;
  case MAX_TYPE:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_5 = 0; j_5 < j; j_5 = j_5 + 1) {
        iVar8 = (**(code **)(*plVar6 + 0x120))(plVar6,message,field,j_5);
        iVar2 = WireFormatLite::SInt64Size(iVar8);
        j_1 = iVar2 + j_1;
      }
    }
    else {
      iVar8 = (**(code **)(*plVar6 + 0x70))(plVar6,message,field);
      j_1 = WireFormatLite::SInt64Size(iVar8);
    }
  }
  return j_1;
}

Assistant:

int WireFormat::FieldDataOnlyByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  int count = 0;
  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  int data_size = 0;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                     \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      if (field->is_repeated()) {                                          \
        for (int j = 0; j < count; j++) {                                  \
          data_size += WireFormatLite::TYPE_METHOD##Size(                  \
            message_reflection->GetRepeated##CPPTYPE_METHOD(               \
              message, field, j));                                         \
        }                                                                  \
      } else {                                                             \
        data_size += WireFormatLite::TYPE_METHOD##Size(                    \
          message_reflection->Get##CPPTYPE_METHOD(message, field));        \
      }                                                                    \
      break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                               \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      data_size += count * WireFormatLite::k##TYPE_METHOD##Size;           \
      break;

    HANDLE_TYPE( INT32,  Int32,  Int32)
    HANDLE_TYPE( INT64,  Int64,  Int64)
    HANDLE_TYPE(SINT32, SInt32,  Int32)
    HANDLE_TYPE(SINT64, SInt64,  Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE( FIXED32,  Fixed32)
    HANDLE_FIXED_TYPE( FIXED64,  Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT , Float )
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP  , Group  , Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
            message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
          message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}